

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O1

Expression *
slang::ast::Expression::bindName
          (Compilation *comp,NameSyntax *syntax,InvocationExpressionSyntax *invocation,
          ArrayOrRandomizeMethodExpressionSyntax *withClause,ASTContext *context)

{
  ulong uVar1;
  underlying_type uVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  Expression *pEVar7;
  int iVar8;
  bitmask<slang::ast::LookupFlags> flags;
  Compilation *pCVar9;
  InvalidExpression *unaff_R13;
  SourceRange SVar10;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  LookupResult result;
  ASTContext *in_stack_fffffffffffffd20;
  Compilation *in_stack_fffffffffffffd28;
  InvalidExpression *local_2c0;
  undefined1 local_2a8 [32];
  size_type local_288;
  size_type local_280;
  variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
  local_278 [4];
  Element *local_1b8;
  BumpAllocator *local_1b0;
  FreeNode *local_1a8;
  Element local_1a0 [2];
  SmallVectorBase<slang::Diagnostic> local_160;
  undefined1 local_68 [24];
  size_t sStack_50;
  size_t local_48;
  undefined1 local_40;
  undefined4 local_3f;
  undefined3 uStack_3b;
  undefined1 local_38;
  
  if (((invocation != (InvocationExpressionSyntax *)0x0) &&
      (invocation->arguments != (ArgumentListSyntax *)0x0)) ||
     (iVar6 = 0, ((comp->options).flags.m_bits & 4) != 0)) {
    iVar6 = 2;
  }
  uVar1 = (context->flags).m_bits;
  pCVar9 = (Compilation *)context->firstTempVar;
  iVar8 = ((uint)uVar1 & 0x40) * 0x20;
  iVar3 = iVar8 + 0x4004;
  if ((uVar1 >> 0x2c & 1) == 0) {
    iVar3 = iVar8;
  }
  uVar2 = iVar3 + iVar6;
  flags.m_bits = uVar2 + 0x1020;
  if ((int)(comp->options).languageVersion < 1) {
    flags.m_bits = uVar2;
  }
  if ((uVar1 >> 0x29 & 1) == 0) {
    flags.m_bits = uVar2;
  }
  if (((pCVar9 == (Compilation *)0x0) && (context->randomizeDetails == (RandomizeDetails *)0x0)) &&
     (context->assertionInstance == (AssertionInstanceDetails *)0x0)) goto LAB_00412a74;
  if (pCVar9 != (Compilation *)0x0) {
    local_2a8._24_8_ = local_278;
    local_2a8._0_8_ = (Symbol *)0x0;
    local_2a8._8_5_ = 0;
    local_2a8._13_3_ = 0;
    local_2a8._16_5_ = 0;
    local_288 = 0;
    local_280 = 4;
    local_1b8 = local_1a0;
    local_1b0 = (BumpAllocator *)0x0;
    local_1a8 = (FreeNode *)0x2;
    local_160.data_ = (pointer)local_160.firstElement;
    local_160.len = 0;
    local_160.cap = 2;
    bVar4 = Lookup::findTempVar((context->scope).ptr,(TempVarSymbol *)pCVar9,syntax,
                                (LookupResult *)local_2a8);
    if (bVar4) {
      LookupResult::reportDiags((LookupResult *)local_2a8,context);
      SVar10 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      pCVar9 = (Compilation *)local_2a8;
      sourceRange.endLoc = (SourceLocation)invocation;
      sourceRange.startLoc = SVar10.endLoc;
      local_2c0 = (InvalidExpression *)
                  bindLookupResult((Expression *)comp,pCVar9,(LookupResult *)SVar10.startLoc,
                                   sourceRange,(InvocationExpressionSyntax *)withClause,
                                   (ArrayOrRandomizeMethodExpressionSyntax *)context,
                                   in_stack_fffffffffffffd20);
    }
    SmallVectorBase<slang::Diagnostic>::cleanup(&local_160,(EVP_PKEY_CTX *)pCVar9);
    if (local_1b8 != local_1a0) {
      operator_delete(local_1b8);
    }
    if ((variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
         *)local_2a8._24_8_ != local_278) {
      operator_delete((void *)local_2a8._24_8_);
    }
    unaff_R13 = local_2c0;
    if (bVar4) {
      return &local_2c0->super_Expression;
    }
  }
  if ((context->randomizeDetails != (RandomizeDetails *)0x0) &&
     (context->randomizeDetails->classType != (Scope *)0x0)) {
    local_2a8._24_8_ = local_278;
    local_2a8._0_8_ = (Symbol *)0x0;
    local_2a8._8_5_ = 0;
    local_2a8._13_3_ = 0;
    local_2a8._16_5_ = 0;
    local_288 = 0;
    local_280 = 4;
    local_1b8 = local_1a0;
    local_1b0 = (BumpAllocator *)0x0;
    local_1a8 = (FreeNode *)0x2;
    local_160.data_ = (pointer)local_160.firstElement;
    local_160.len = 0;
    local_160.cap = 2;
    pCVar9 = (Compilation *)syntax;
    bVar4 = Lookup::withinClassRandomize(context,syntax,flags,(LookupResult *)local_2a8);
    if (bVar4) {
      LookupResult::reportDiags((LookupResult *)local_2a8,context);
      SVar10 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)pCVar9);
      syntax = (NameSyntax *)local_2a8;
      sourceRange_01.endLoc = (SourceLocation)invocation;
      sourceRange_01.startLoc = SVar10.endLoc;
      unaff_R13 = (InvalidExpression *)
                  bindLookupResult((Expression *)comp,(Compilation *)syntax,
                                   (LookupResult *)SVar10.startLoc,sourceRange_01,
                                   (InvocationExpressionSyntax *)withClause,
                                   (ArrayOrRandomizeMethodExpressionSyntax *)context,
                                   in_stack_fffffffffffffd20);
LAB_00412dd4:
      bVar4 = false;
    }
    else {
      bVar5 = LookupResult::hasError((LookupResult *)local_2a8);
      bVar4 = true;
      if (bVar5) {
        LookupResult::reportDiags((LookupResult *)local_2a8,context);
        syntax = (NameSyntax *)local_68;
        local_68._0_8_ = (Segment *)0x0;
        unaff_R13 = BumpAllocator::
                    emplace<slang::ast::InvalidExpression,slang::ast::Expression_const*&,slang::ast::Type_const&>
                              (&comp->super_BumpAllocator,(Expression **)syntax,comp->errorType);
        goto LAB_00412dd4;
      }
    }
    SmallVectorBase<slang::Diagnostic>::cleanup(&local_160,(EVP_PKEY_CTX *)syntax);
    syntax = (NameSyntax *)pCVar9;
    if (local_1b8 != local_1a0) {
      operator_delete(local_1b8);
      syntax = (NameSyntax *)pCVar9;
    }
    if ((variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
         *)local_2a8._24_8_ != local_278) {
      operator_delete((void *)local_2a8._24_8_);
    }
    if (!bVar4) {
      return &unaff_R13->super_Expression;
    }
  }
  in_stack_fffffffffffffd28 = (Compilation *)syntax;
  if (context->assertionInstance != (AssertionInstanceDetails *)0x0) {
    local_2a8._24_8_ = local_278;
    local_2a8._0_8_ = (Symbol *)0x0;
    local_2a8._8_5_ = 0;
    local_2a8._13_3_ = 0;
    local_2a8._16_5_ = 0;
    local_288 = 0;
    local_280 = 4;
    local_1b8 = local_1a0;
    local_1b0 = (BumpAllocator *)0x0;
    local_1a8 = (FreeNode *)0x2;
    local_160.data_ = (pointer)local_160.firstElement;
    local_160.len = 0;
    local_160.cap = 2;
    pCVar9 = (Compilation *)syntax;
    bVar4 = Lookup::findAssertionLocalVar(context,syntax,(LookupResult *)local_2a8);
    if (bVar4) {
      LookupResult::reportDiags((LookupResult *)local_2a8,context);
      SVar10 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)pCVar9);
      syntax = (NameSyntax *)local_2a8;
      sourceRange_02.endLoc = (SourceLocation)invocation;
      sourceRange_02.startLoc = SVar10.endLoc;
      unaff_R13 = (InvalidExpression *)
                  bindLookupResult((Expression *)comp,(Compilation *)syntax,
                                   (LookupResult *)SVar10.startLoc,sourceRange_02,
                                   (InvocationExpressionSyntax *)withClause,
                                   (ArrayOrRandomizeMethodExpressionSyntax *)context,
                                   in_stack_fffffffffffffd20);
    }
    SmallVectorBase<slang::Diagnostic>::cleanup(&local_160,(EVP_PKEY_CTX *)syntax);
    syntax = (NameSyntax *)pCVar9;
    if (local_1b8 != local_1a0) {
      operator_delete(local_1b8);
      syntax = (NameSyntax *)pCVar9;
    }
    if ((variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
         *)local_2a8._24_8_ != local_278) {
      operator_delete((void *)local_2a8._24_8_);
    }
    in_stack_fffffffffffffd28 = (Compilation *)syntax;
    if (bVar4) {
      return &unaff_R13->super_Expression;
    }
  }
LAB_00412a74:
  local_2a8._0_8_ = (Symbol *)0x0;
  local_2a8._8_5_ = 0;
  local_2a8._13_3_ = 0;
  local_2a8._16_5_ = 0;
  local_288 = 0;
  local_280 = 4;
  local_1b0 = (BumpAllocator *)0x0;
  local_1a8 = (FreeNode *)0x2;
  local_160.data_ = (pointer)local_160.firstElement;
  local_160.len = 0;
  local_160.cap = 2;
  local_2a8._24_8_ = local_278;
  local_1b8 = local_1a0;
  Lookup::name(syntax,context,flags,(LookupResult *)local_2a8);
  LookupResult::reportDiags((LookupResult *)local_2a8,context);
  if (CONCAT35(local_2a8._13_3_,local_2a8._8_5_) == 0) {
    SVar10 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    pCVar9 = (Compilation *)local_2a8;
    sourceRange_00.endLoc = (SourceLocation)invocation;
    sourceRange_00.startLoc = SVar10.endLoc;
    pEVar7 = bindLookupResult((Expression *)comp,pCVar9,(LookupResult *)SVar10.startLoc,
                              sourceRange_00,(InvocationExpressionSyntax *)withClause,
                              (ArrayOrRandomizeMethodExpressionSyntax *)context,
                              in_stack_fffffffffffffd20);
  }
  else {
    if (invocation != (InvocationExpressionSyntax *)0x0) {
      syntax = (NameSyntax *)invocation;
    }
    SVar10 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    local_68._0_8_ = CONCAT35(local_2a8._13_3_,local_2a8._8_5_);
    local_68._8_8_ = (context->scope).ptr;
    pCVar9 = (Compilation *)local_68;
    local_68._16_8_ = (value_type_pointer)0x0;
    sStack_50 = 0;
    local_48 = 0;
    local_3f = 0;
    uStack_3b = 0;
    local_40 = 0;
    local_38 = 1;
    pEVar7 = CallExpression::fromLookup
                       ((CallExpression *)comp,pCVar9,(Subroutine *)0x0,(Expression *)invocation,
                        (InvocationExpressionSyntax *)withClause,
                        (ArrayOrRandomizeMethodExpressionSyntax *)context,SVar10,
                        (ASTContext *)in_stack_fffffffffffffd28);
  }
  SmallVectorBase<slang::Diagnostic>::cleanup(&local_160,(EVP_PKEY_CTX *)pCVar9);
  if (local_1b8 != local_1a0) {
    operator_delete(local_1b8);
  }
  if ((variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
       *)local_2a8._24_8_ != local_278) {
    operator_delete((void *)local_2a8._24_8_);
  }
  return pEVar7;
}

Assistant:

Expression& Expression::bindName(Compilation& comp, const NameSyntax& syntax,
                                 const InvocationExpressionSyntax* invocation,
                                 const ArrayOrRandomizeMethodExpressionSyntax* withClause,
                                 const ASTContext& context) {
    bitmask<LookupFlags> flags = LookupFlags::None;
    if ((invocation && invocation->arguments) ||
        comp.hasFlag(CompilationFlags::AllowUseBeforeDeclare)) {
        flags |= LookupFlags::AllowDeclaredAfter;
    }

    if (context.flags.has(ASTFlags::StaticInitializer))
        flags |= LookupFlags::StaticInitializer;

    if (context.flags.has(ASTFlags::BindInstantiation))
        flags |= LookupFlags::DisallowWildcardImport | LookupFlags::DisallowUnitReferences;

    if (context.flags.has(ASTFlags::TypeOperator) &&
        comp.languageVersion() >= LanguageVersion::v1800_2023) {
        // v1800-2023: Type operator expressions are allowed to reference
        // incomplete forward class types now.
        flags |= LookupFlags::AllowIncompleteForwardTypedefs | LookupFlags::TypeReference;
    }

    // Special case scenarios: temporary variables, class-scoped randomize calls,
    // and expanding sequences and properties.
    if (context.firstTempVar || context.randomizeDetails || context.assertionInstance) {
        // If we have any temporary variables, they need to be findable even though they aren't
        // added to any scope. Check for that case and manually look for its name here.
        if (context.firstTempVar) {
            LookupResult result;
            if (Lookup::findTempVar(*context.scope, *context.firstTempVar, syntax, result)) {
                result.reportDiags(context);
                return bindLookupResult(comp, result, syntax.sourceRange(), invocation, withClause,
                                        context);
            }
        }

        if (context.randomizeDetails && context.randomizeDetails->classType) {
            // Inside a class-scoped randomize call, first do a lookup in the class scope.
            // If it's not found, we proceed to do a normal lookup.
            LookupResult result;
            if (Lookup::withinClassRandomize(context, syntax, flags, result)) {
                result.reportDiags(context);
                return bindLookupResult(comp, result, syntax.sourceRange(), invocation, withClause,
                                        context);
            }
            else if (result.hasError()) {
                result.reportDiags(context);
                return badExpr(comp, nullptr);
            }
        }

        if (context.assertionInstance) {
            // Look for a matching local assertion variable.
            LookupResult result;
            if (Lookup::findAssertionLocalVar(context, syntax, result)) {
                result.reportDiags(context);
                return bindLookupResult(comp, result, syntax.sourceRange(), invocation, withClause,
                                        context);
            }
        }
    }

    // Normal name lookup and resolution.
    LookupResult result;
    Lookup::name(syntax, context, flags, result);
    result.reportDiags(context);

    if (result.systemSubroutine) {
        // There won't be any selectors here; this gets checked in the lookup call.
        SLANG_ASSERT(result.selectors.empty());

        SourceRange callRange = invocation ? invocation->sourceRange() : syntax.sourceRange();
        CallExpression::SystemCallInfo callInfo{result.systemSubroutine, context.scope, {}};
        return CallExpression::fromLookup(comp, callInfo, nullptr, invocation, withClause,
                                          callRange, context);
    }

    return bindLookupResult(comp, result, syntax.sourceRange(), invocation, withClause, context);
}